

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

int regcomp(regex_t *__preg,char *__pattern,int __cflags)

{
  ulong uVar1;
  cat_t *pcVar2;
  bool bVar3;
  char **ppcVar4;
  int iVar5;
  size_t sVar6;
  re_guts *__ptr;
  sop *psVar7;
  char *pcVar8;
  char *pcVar9;
  parse *extraout_RDX;
  parse *ppVar10;
  long lVar11;
  uint uVar12;
  cat_t cVar13;
  int iVar14;
  uint uVar15;
  parse *ppVar16;
  uch *puVar17;
  ulong uVar18;
  ulong uVar19;
  parse *ppVar20;
  long lVar21;
  parse *p;
  parse pa;
  parse local_110;
  
  if ((~__cflags & 0x11U) == 0) {
    return 0x10;
  }
  if ((__cflags & 0x20U) == 0) {
    sVar6 = strlen(__pattern);
  }
  else {
    sVar6 = (long)__preg->used - (long)__pattern;
    if ((char *)__preg->used < __pattern) {
      return 0x10;
    }
  }
  __ptr = (re_guts *)malloc(399);
  if (__ptr == (re_guts *)0x0) {
    return 0xc;
  }
  local_110.ssize = (sVar6 >> 1) * 3 + 1;
  if ((ulong)local_110.ssize >> 0x3c != 0 || (ulong)local_110.ssize < sVar6) {
    free(__ptr);
    return 0x10;
  }
  local_110.strip = (sop *)malloc(local_110.ssize * 8);
  local_110.slen = 0;
  if (local_110.strip == (sop *)0x0) {
    free(__ptr);
    return 0xc;
  }
  local_110.end = __pattern + sVar6;
  local_110.error = 0;
  local_110.ncsalloc = 0;
  local_110.next = __pattern;
  local_110.g = __ptr;
  memset(local_110.pbegin,0,0xa0);
  __ptr->csetsize = 0x100;
  *(undefined8 *)&__ptr->ncsets = 0;
  *(undefined8 *)((long)&__ptr->sets + 4) = 0;
  *(undefined4 *)((long)&__ptr->setbits + 4) = 0;
  __ptr->cflags = __cflags;
  __ptr->iflags = 0;
  __ptr->nbol = 0;
  __ptr->neol = 0;
  __ptr->ncategories = 1;
  __ptr->must = (char *)0x0;
  __ptr->mlen = 0;
  __ptr->nsub = 0;
  __ptr->categories = (cat_t *)&__ptr[1].backrefs;
  memset(__ptr->catspace,0,0x100);
  __ptr->backrefs = 0;
  doemit(&local_110,0x4000000,0);
  __ptr->firststate = local_110.slen + -1;
  if ((__cflags & 1U) == 0) {
    if ((__cflags & 0x10U) == 0) {
      p_bre(&local_110,0x80,0x80);
    }
    else {
      p_str(&local_110);
    }
  }
  else {
    p_ere(&local_110,0x80);
  }
  p = &local_110;
  doemit(p,0x4000000,0);
  __ptr->laststate = local_110.slen + -1;
  if (local_110.error == 0) {
    pcVar2 = __ptr->categories;
    uVar19 = 0xffffffffffffff80;
    do {
      if ((pcVar2[uVar19] == '\0') && (iVar14 = __ptr->ncsets, 0 < iVar14)) {
        uVar12 = iVar14 + 7U >> 3;
        puVar17 = __ptr->setbits;
        if (uVar12 < 2) {
          uVar12 = 1;
        }
        do {
          if (puVar17[uVar19 & 0xff] != '\0') {
            iVar14 = __ptr->ncategories;
            __ptr->ncategories = iVar14 + 1;
            cVar13 = (cat_t)iVar14;
            pcVar2[uVar19] = cVar13;
            uVar18 = uVar19;
            if ((long)uVar19 < 0x7f) {
              do {
                uVar1 = uVar18 + 1;
                if (pcVar2[uVar18 + 1] == '\0') {
                  iVar14 = __ptr->ncsets;
                  if (0 < iVar14) {
                    uVar12 = iVar14 + 7U >> 3;
                    puVar17 = __ptr->setbits;
                    p = (parse *)(uVar1 & 0xff);
                    if (uVar12 < 2) {
                      uVar12 = 1;
                    }
                    do {
                      if (puVar17[uVar19 & 0xff] != puVar17[(long)p]) goto LAB_00103926;
                      puVar17 = puVar17 + __ptr->csetsize;
                      uVar12 = uVar12 - 1;
                    } while (uVar12 != 0);
                  }
                  pcVar2[uVar1] = cVar13;
                }
LAB_00103926:
                uVar18 = uVar1;
              } while (uVar1 != 0x7f);
            }
            break;
          }
          puVar17 = puVar17 + __ptr->csetsize;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 0x80);
  }
  __ptr->nstates = local_110.slen;
  psVar7 = (sop *)realloc(local_110.strip,local_110.slen << 3);
  __ptr->strip = psVar7;
  if (psVar7 == (sop *)0x0) {
    if (local_110.error == 0) {
      local_110.error = 0xc;
    }
    local_110.next = nuls;
    local_110.end = nuls;
    __ptr->strip = local_110.strip;
  }
  if (local_110.error != 0) {
    __ptr->nplus = 0;
    __ptr->magic = 0xd245;
    __preg->allocated = __ptr->nsub;
    __preg->syntax = (reg_syntax_t)__ptr;
    *(undefined4 *)&__preg->buffer = 0xf265;
    regfree(__preg);
    return local_110.error;
  }
  ppVar16 = (parse *)(__ptr->strip + 1);
  iVar14 = 0;
  ppVar10 = extraout_RDX;
LAB_00103749:
  ppVar20 = (parse *)&ppVar16->end;
  pcVar8 = ppVar16->next;
  uVar12 = (uint)pcVar8;
  uVar19 = (ulong)(uVar12 & 0x7c000000) - 0x8000000 >> 0x1a;
  if (uVar19 < 0xe) {
    iVar5 = iVar14;
    if ((0x1880UL >> (uVar19 & 0x3f) & 1) != 0) goto LAB_001037d5;
    if ((0x2200UL >> (uVar19 & 0x3f) & 1) == 0) {
      if (uVar19 == 0) {
        if (iVar14 == 0) {
          ppVar10 = ppVar16;
        }
        iVar5 = iVar14 + 1;
        goto LAB_001037d5;
      }
      goto LAB_001037c5;
    }
    do {
      ppVar16 = (parse *)(ppVar16->pbegin + ((ulong)((uint)pcVar8 & 0x3ffffff) - 8));
      pcVar8 = ppVar16->next;
      uVar12 = (uint)pcVar8;
      uVar15 = uVar12 & 0x7c000000;
    } while (uVar15 == 0x44000000);
    ppVar20 = ppVar16;
    if ((uVar15 != 0x30000000) && (uVar15 != 0x48000000)) {
      *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
      goto LAB_00103936;
    }
  }
LAB_001037c5:
  iVar5 = 0;
  if (__ptr->mlen < iVar14) {
    __ptr->mlen = iVar14;
    p = ppVar10;
  }
LAB_001037d5:
  iVar14 = iVar5;
  ppVar16 = ppVar20;
  if ((uVar12 & 0x7c000000) == 0x4000000) {
    iVar14 = __ptr->mlen;
    lVar21 = (long)iVar14;
    if (lVar21 != 0) {
      pcVar8 = (char *)malloc(lVar21 + 1);
      __ptr->must = pcVar8;
      if (pcVar8 == (char *)0x0) {
        __ptr->mlen = 0;
      }
      else {
        pcVar9 = pcVar8;
        if (0 < iVar14) {
          lVar11 = lVar21;
          do {
            do {
              ppcVar4 = &p->next;
              p = (parse *)&p->end;
            } while (((uint)*ppcVar4 & 0x7c000000) != 0x8000000);
            if (pcVar8 + lVar21 <= pcVar9) {
              __assert_fail("cp < g->must + g->mlen",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                            ,0x68f,"void findmust()");
            }
            *pcVar9 = (char)*ppcVar4;
            pcVar9 = pcVar9 + 1;
            bVar3 = 1 < lVar11;
            lVar11 = lVar11 + -1;
          } while (bVar3);
        }
        if (pcVar9 != pcVar8 + lVar21) {
          __assert_fail("cp == g->must + g->mlen",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x692,"void findmust()");
        }
        *pcVar9 = '\0';
      }
    }
LAB_00103936:
    psVar7 = __ptr->strip;
    lVar11 = 0;
    lVar21 = 0;
    do {
      psVar7 = psVar7 + 1;
      uVar12 = (uint)*psVar7 & 0x7c000000;
      if (uVar12 == 0x28000000) {
        if (lVar21 < lVar11) {
          lVar21 = lVar11;
        }
        lVar11 = lVar11 + -1;
      }
      else if (uVar12 == 0x24000000) {
        lVar11 = lVar11 + 1;
      }
    } while (uVar12 != 0x4000000);
    if (lVar11 != 0) {
      *(byte *)&__ptr->iflags = (byte)__ptr->iflags | 4;
    }
    __ptr->nplus = lVar21;
    __ptr->magic = 0xd245;
    __preg->allocated = __ptr->nsub;
    __preg->syntax = (reg_syntax_t)__ptr;
    *(undefined4 *)&__preg->buffer = 0xf265;
    return local_110.error;
  }
  goto LAB_00103749;
}

Assistant:

int				/* 0 success, otherwise REG_something */
regcomp(preg, pattern, cflags)
regex_t *preg;
const char *pattern;
int cflags;
{
	struct parse pa;
	struct re_guts *g;
	struct parse *p = &pa;
	unsigned int i;
	size_t len;

	if ((cflags&REG_EXTENDED) && (cflags&REG_NOSPEC))
		return(REG_INVARG);

	if (cflags&REG_PEND) {
		if (preg->re_endp < pattern)
			return(REG_INVARG);
		len = (size_t) (preg->re_endp - pattern);
	} else
		len = strlen((char *)pattern);

	/* do the mallocs early so failure handling is easy */
	g = (struct re_guts *)malloc(sizeof(struct re_guts) +
							(NC-1)*sizeof(cat_t));
	if (g == NULL)
		return(REG_ESPACE);
	{
	  /* Patched for CERT Vulnerability Note VU#695940, Feb 2015. */
	  size_t new_ssize = len/(size_t)2*(size_t)3 + (size_t)1; /* ugh */
	  if (new_ssize < len || new_ssize > LONG_MAX / sizeof(sop)) {
	    free((char *) g);
	    return REG_INVARG;
	  }
	  p->ssize = (sopno)new_ssize;
	}
	p->strip = (sop *)malloc((size_t)p->ssize * sizeof(sop));
	p->slen = 0;
	if (p->strip == NULL) {
		free((char *)g);
		return(REG_ESPACE);
	}

	/* set things up */
	p->g = g;
	p->next = (char *)pattern;	/* convenience; we do not modify it */
	p->end = p->next + len;
	p->error = 0;
	p->ncsalloc = 0;
	for (i = 0; i < NPAREN; i++) {
		p->pbegin[i] = 0;
		p->pend[i] = 0;
	}
	g->csetsize = NC;
	g->sets = NULL;
	g->setbits = NULL;
	g->ncsets = 0;
	g->cflags = cflags;
	g->iflags = 0;
	g->nbol = 0;
	g->neol = 0;
	g->must = NULL;
	g->mlen = 0;
	g->nsub = 0;
	g->ncategories = 1;	/* category 0 is "everything else" */
	g->categories = &g->catspace[-(CHAR_MIN)];
	(void) memset((char *)g->catspace, 0, NC*sizeof(cat_t));
	g->backrefs = 0;

	/* do it */
	EMIT(OEND, 0);
	g->firststate = THERE();
	if (cflags&REG_EXTENDED)
		p_ere(p, OUT);
	else if (cflags&REG_NOSPEC)
		p_str(p);
	else
		p_bre(p, OUT, OUT);
	EMIT(OEND, 0);
	g->laststate = THERE();

	/* tidy up loose ends and fill things in */
	categorize(p, g);
	stripsnug(p, g);
	findmust(p, g);
	g->nplus = pluscount(p, g);
	g->magic = MAGIC2;
	preg->re_nsub = g->nsub;
	preg->re_g = g;
	preg->re_magic = MAGIC1;
#ifndef REDEBUG
	/* not debugging, so can't rely on the assert() in regexec() */
	if (g->iflags&BAD)
		seterr(p, REG_ASSERT);
#endif

	/* win or lose, we're done */
	if (p->error != 0)	/* lose */
		regfree(preg);
	return(p->error);
}